

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

void tinfzlib(void)

{
  int iVar1;
  greatest_test_res gVar2;
  greatest_test_res res_7;
  greatest_test_res res_6;
  greatest_test_res res_5;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  size_t i;
  char suffix [32];
  
  iVar1 = greatest_test_pre("zlib_empty_raw");
  if (iVar1 == 1) {
    gVar2 = zlib_empty_raw();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("zlib_empty_fixed");
  if (iVar1 == 1) {
    gVar2 = zlib_empty_fixed();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("zlib_empty_dynamic");
  if (iVar1 == 1) {
    gVar2 = zlib_empty_dynamic();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("zlib_onebyte_raw");
  if (iVar1 == 1) {
    gVar2 = zlib_onebyte_raw();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("zlib_onebyte_fixed");
  if (iVar1 == 1) {
    gVar2 = zlib_onebyte_fixed();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("zlib_onebyte_dynamic");
  if (iVar1 == 1) {
    gVar2 = zlib_onebyte_dynamic();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("zlib_zeroes");
  if (iVar1 == 1) {
    gVar2 = zlib_zeroes();
    greatest_test_post(gVar2);
  }
  for (_res_1 = 0; _res_1 < 8; _res_1 = _res_1 + 1) {
    sprintf((char *)&i,"%d",_res_1 & 0xffffffff);
    greatest_set_test_suffix((char *)&i);
    iVar1 = greatest_test_pre("zlib_error_case");
    if (iVar1 == 1) {
      gVar2 = zlib_error_case(zlib_errors + _res_1);
      greatest_test_post(gVar2);
    }
  }
  return;
}

Assistant:

SUITE(tinfzlib)
{
	char suffix[32];
	size_t i;

	RUN_TEST(zlib_empty_raw);
	RUN_TEST(zlib_empty_fixed);
	RUN_TEST(zlib_empty_dynamic);

	RUN_TEST(zlib_onebyte_raw);
	RUN_TEST(zlib_onebyte_fixed);
	RUN_TEST(zlib_onebyte_dynamic);
	RUN_TEST(zlib_zeroes);

	for (i = 0; i < ARRAY_SIZE(zlib_errors); ++i) {
		sprintf(suffix, "%d", (int) i);
		greatest_set_test_suffix(suffix);
		RUN_TEST1(zlib_error_case, &zlib_errors[i]);
	}
}